

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

void kwsysProcessChildErrorExit(int errorPipe)

{
  int *piVar1;
  char *__src;
  size_t __n;
  char buffer [1024];
  char acStack_418 [1032];
  
  piVar1 = __errno_location();
  __src = strerror(*piVar1);
  strncpy(acStack_418,__src,0x400);
  __n = strlen(acStack_418);
  write(errorPipe,acStack_418,__n);
  _exit(1);
}

Assistant:

static void kwsysProcessChildErrorExit(int errorPipe)
{
  /* Construct the error message.  */
  char buffer[KWSYSPE_PIPE_BUFFER_SIZE];
  kwsysProcess_ssize_t result;
  strncpy(buffer, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);

  /* Report the error to the parent through the special pipe.  */
  result = write(errorPipe, buffer, strlen(buffer));
  (void)result;

  /* Terminate without cleanup.  */
  _exit(1);
}